

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symmetric_difference_iterator.hpp
# Opt level: O0

void __thiscall
burst::
symmetric_difference_iterator<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>_>_>_>,_std::greater<void>_>
::symmetric_difference_iterator
          (symmetric_difference_iterator<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>_>_>_>,_std::greater<void>_>
           *this,owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>_>_>_>
                 *first,
          owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>_>_>_>
          *last)

{
  bool bVar1;
  owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>_>_>_>
  local_58;
  owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>_>_>_>
  local_40;
  owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>_>_>_>
  *local_28;
  outer_range_iterator *last_local;
  outer_range_iterator *first_local;
  symmetric_difference_iterator<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>_>_>_>,_std::greater<void>_>
  *this_local;
  
  local_28 = last;
  last_local = first;
  first_local = &this->m_begin;
  owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>_>_>_>
  ::owning_iterator(&this->m_begin,first);
  owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>_>_>_>
  ::owning_iterator(&this->m_end,last);
  owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>_>_>_>
  ::owning_iterator(&this->m_min_end,&this->m_begin);
  owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>_>_>_>
  ::owning_iterator(&local_40,&this->m_begin);
  owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>_>_>_>
  ::owning_iterator(&local_58,&this->m_end);
  bVar1 = std::
          all_of<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::_List_iterator<int>,std::_Deque_iterator<int,int&,int*>>>,std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::_List_iterator<int>,std::_Deque_iterator<int,int&,int*>>>>>>,burst::symmetric_difference_iterator<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::_List_iterator<int>,std::_Deque_iterator<int,int&,int*>>>,std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::_List_iterator<int>,std::_Deque_iterator<int,int&,int*>>>>>>,std::greater<void>>::symmetric_difference_iterator(burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::_List_iterator<int>,std::_Deque_iterator<int,int&,int*>>>,std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::_List_iterator<int>,std::_Deque_iterator<int,int&,int*>>>>>>,burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::_List_iterator<int>,std::_Deque_iterator<int,int&,int*>>>,std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::_List_iterator<int>,std::_Deque_iterator<int,int&,int*>>>>>>,std::greater<void>)::_lambda(auto:1_const&)_1_>
                    (&local_40,&local_58,(anon_class_8_1_8991fb9c)this);
  if (!bVar1) {
    __assert_fail("std::all_of(m_begin, m_end, [this] (const auto & range) { return boost::algorithm::is_sorted(range, m_compare); })"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/iterator/symmetric_difference_iterator.hpp"
                  ,0x76,
                  "burst::symmetric_difference_iterator<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int *, std::vector<int>>, std::_List_iterator<int>, std::_Deque_iterator<int, int &, int *>>>>>, std::greater<void>>::symmetric_difference_iterator(outer_range_iterator, outer_range_iterator, Compare) [RandomAccessIterator = burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int *, std::vector<int>>, std::_List_iterator<int>, std::_Deque_iterator<int, int &, int *>>>>>, Compare = std::greater<void>]"
                 );
  }
  owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>_>_>_>
  ::~owning_iterator(&local_58);
  owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>_>_>_>
  ::~owning_iterator(&local_40);
  settle(this);
  return;
}

Assistant:

symmetric_difference_iterator
            (
                outer_range_iterator first, outer_range_iterator last,
                Compare compare = Compare()
            ):
            m_begin(std::move(first)),
            m_end(std::move(last)),
            m_min_end(m_begin),
            m_compare(compare)
        {
            BOOST_ASSERT(std::all_of(m_begin, m_end,
                [this] (const auto & range)
                {
                    return boost::algorithm::is_sorted(range, m_compare);
                }));

            settle();
        }